

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QFont::Tag>::reserve(QList<QFont::Tag> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QFont::Tag> *pQVar3;
  qsizetype qVar4;
  Tag *b;
  Data *pDVar5;
  long in_RSI;
  QArrayDataPointer<QFont::Tag> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QFont::Tag> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QFont::Tag> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QFont::Tag> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<QFont::Tag> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QFont::Tag> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QArrayDataPointer<QFont::Tag> *)capacity((QList<QFont::Tag> *)0x6101bf);
  qVar4 = QArrayDataPointer<QFont::Tag>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar3 - qVar4) {
    QArrayDataPointer<QFont::Tag>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QFont::Tag>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_00610362;
    QArrayDataPointer<QFont::Tag>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QFont::Tag>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QFont::Tag>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QFont::Tag>::setFlag
                ((QArrayDataPointer<QFont::Tag> *)0x610266,(ArrayOptions)f.i);
      goto LAB_00610362;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (Tag *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QFont::Tag> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QFont::Tag>::QArrayDataPointer
            (pQVar3,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar3 = (QArrayDataPointer<QFont::Tag> *)QArrayDataPointer<QFont::Tag>::operator->(&local_38);
  QArrayDataPointer<QFont::Tag>::operator->(in_RDI);
  b = QArrayDataPointer<QFont::Tag>::begin((QArrayDataPointer<QFont::Tag> *)0x6102e6);
  QArrayDataPointer<QFont::Tag>::operator->(in_RDI);
  QArrayDataPointer<QFont::Tag>::end(pQVar3);
  QtPrivate::QGenericArrayOps<QFont::Tag>::copyAppend(in_stack_ffffffffffffff90,b,(Tag *)pQVar3);
  pDVar5 = QArrayDataPointer<QFont::Tag>::d_ptr(&local_38);
  if (pDVar5 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QFont::Tag> *)QArrayDataPointer<QFont::Tag>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar3,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QFont::Tag>::setFlag
              ((QArrayDataPointer<QFont::Tag> *)0x610349,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QFont::Tag>::swap(pQVar3,in_stack_ffffffffffffff78);
  QArrayDataPointer<QFont::Tag>::~QArrayDataPointer(pQVar3);
LAB_00610362:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}